

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O0

string * __thiscall
cmExtraCodeLiteGenerator::GetConfigurationName_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeLiteGenerator *this,cmMakefile *mf)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  allocator local_5d [20];
  allocator local_49;
  string local_48;
  undefined1 local_21;
  cmMakefile *local_20;
  cmMakefile *mf_local;
  cmExtraCodeLiteGenerator *this_local;
  string *confName;
  
  local_21 = 0;
  local_20 = mf;
  mf_local = (cmMakefile *)this;
  this_local = (cmExtraCodeLiteGenerator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"CMAKE_BUILD_TYPE",&local_49);
  pcVar1 = cmMakefile::GetSafeDefinition(mf,&local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,local_5d);
  std::allocator<char>::~allocator((allocator<char> *)local_5d);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::__cxx11::string::find_first_not_of((char *)__return_storage_ptr__,0xa9d2cd);
  std::__cxx11::string::erase((ulong)__return_storage_ptr__,0);
  lVar2 = std::__cxx11::string::find_last_not_of((char *)__return_storage_ptr__,0xa9d2cd);
  std::__cxx11::string::erase((ulong)__return_storage_ptr__,lVar2 + 1);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"NoConfig");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
cmExtraCodeLiteGenerator::GetConfigurationName(const cmMakefile* mf) const
{
  std::string confName = mf->GetSafeDefinition("CMAKE_BUILD_TYPE");
  // Trim the configuration name from whitespaces (left and right)
  confName.erase(0, confName.find_first_not_of(" \t\r\v\n"));
  confName.erase(confName.find_last_not_of(" \t\r\v\n")+1);
  if ( confName.empty() )
    {
    confName = "NoConfig";
    }
  return confName;
}